

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeAddrMode2IdxInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t Imm12;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  DecodeStatus DVar8;
  uint Val;
  uint32_t uVar9;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint tmp;
  uint amt;
  uint idx_mode;
  uint W;
  uint P;
  uint reg;
  uint pred;
  uint imm;
  uint Rm;
  uint Rt;
  uint Rn;
  _Bool writeback;
  ARM_AM_ShiftOpc Opc;
  ARM_AM_AddrOpc Op;
  DecodeStatus S;
  void *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar10;
  char cVar11;
  undefined4 in_stack_ffffffffffffff84;
  uint startBit;
  uint numBits;
  uint numBits_00;
  uint numBits_01;
  undefined4 in_stack_ffffffffffffff9c;
  uint local_5c;
  ARM_AM_ShiftOpc local_34;
  ARM_AM_AddrOpc local_30;
  DecodeStatus local_2c [6];
  uint32_t local_14;
  MCInst *local_10;
  DecodeStatus local_4;
  
  local_2c[0] = MCDisassembler_Success;
  numBits_00 = 4;
  local_14 = in_ESI;
  local_10 = in_RDI;
  uVar2 = fieldFromInstruction_4(in_ESI,0x10,4);
  numBits = 0xc;
  uVar3 = fieldFromInstruction_4(local_14,0xc,numBits_00);
  startBit = 0;
  fieldFromInstruction_4(local_14,0,numBits_00);
  Imm12 = fieldFromInstruction_4(local_14,startBit,numBits);
  fieldFromInstruction_4(local_14,0x1c,numBits_00);
  numBits_01 = 1;
  uVar4 = fieldFromInstruction_4(local_14,0x19,1);
  uVar5 = fieldFromInstruction_4(local_14,0x18,numBits_01);
  uVar6 = fieldFromInstruction_4(local_14,0x15,numBits_01);
  local_5c = 0;
  uVar7 = MCInst_getOpcode(local_10);
  if ((uVar7 - 0x1a5 < 4) || (uVar7 - 0x1bd < 4)) {
    DVar8 = DecodeGPRRegisterClass
                      ((MCInst *)CONCAT44(in_stack_ffffffffffffff9c,uVar7),numBits_01,
                       CONCAT44(numBits,startBit),
                       (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    _Var1 = Check(local_2c,DVar8);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  DVar8 = DecodeGPRRegisterClass
                    ((MCInst *)CONCAT44(in_stack_ffffffffffffff9c,uVar7),numBits_01,
                     CONCAT44(numBits,startBit),
                     (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  _Var1 = Check(local_2c,DVar8);
  if (_Var1) {
    Val = MCInst_getOpcode(local_10);
    if ((Val - 0x9c < 4) || (Val - 0xbe < 4)) {
      DVar8 = DecodeGPRRegisterClass
                        ((MCInst *)CONCAT44(in_stack_ffffffffffffff9c,uVar7),numBits_01,
                         CONCAT44(numBits,startBit),(void *)CONCAT44(Val,in_stack_ffffffffffffff80))
      ;
      _Var1 = Check(local_2c,DVar8);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    DVar8 = DecodeGPRRegisterClass
                      ((MCInst *)CONCAT44(in_stack_ffffffffffffff9c,uVar7),numBits_01,
                       CONCAT44(numBits,startBit),(void *)CONCAT44(Val,in_stack_ffffffffffffff80));
    _Var1 = Check(local_2c,DVar8);
    if (_Var1) {
      uVar9 = fieldFromInstruction_4(local_14,0x17,1);
      local_30 = (ARM_AM_AddrOpc)(uVar9 != 0);
      uVar10 = CONCAT13(1,(int3)in_stack_ffffffffffffff80);
      if (uVar5 != 0) {
        uVar10 = CONCAT13(uVar6 == 1,(int3)in_stack_ffffffffffffff80);
      }
      cVar11 = (char)((uint)uVar10 >> 0x18);
      if ((uVar5 == 0) || (cVar11 == '\0')) {
        if ((uVar5 == 0) && (cVar11 != '\0')) {
          local_5c = 2;
        }
      }
      else {
        local_5c = 1;
      }
      if ((cVar11 != '\0') && ((uVar2 == 0xf || (uVar2 == uVar3)))) {
        local_2c[0] = MCDisassembler_SoftFail;
      }
      if (uVar4 == 0) {
        MCOperand_CreateReg0(local_10,0);
        uVar7 = ARM_AM_getAM2Opc(local_30,Imm12,ARM_AM_lsl,local_5c);
        MCOperand_CreateImm0(local_10,(ulong)uVar7);
      }
      else {
        DVar8 = DecodeGPRnopcRegisterClass
                          ((MCInst *)CONCAT44(numBits_01,numBits_00),numBits,CONCAT44(Val,uVar10),
                           in_stack_ffffffffffffff78);
        _Var1 = Check(local_2c,DVar8);
        if (!_Var1) {
          return MCDisassembler_Fail;
        }
        uVar2 = fieldFromInstruction_4(local_14,5,2);
        in_stack_ffffffffffffff78 = (void *)(ulong)uVar2;
        switch(in_stack_ffffffffffffff78) {
        case (void *)0x0:
          local_34 = ARM_AM_lsl;
          break;
        case (void *)0x1:
          local_34 = ARM_AM_lsr;
          break;
        case (void *)0x2:
          local_34 = ARM_AM_asr;
          break;
        case (void *)0x3:
          local_34 = ARM_AM_ror;
          break;
        default:
          return MCDisassembler_Fail;
        }
        uVar2 = fieldFromInstruction_4(local_14,7,5);
        if ((local_34 == ARM_AM_ror) && (uVar2 == 0)) {
          local_34 = ARM_AM_rrx;
        }
        uVar7 = ARM_AM_getAM2Opc(local_30,uVar2,local_34,local_5c);
        MCOperand_CreateImm0(local_10,(ulong)uVar7);
      }
      DVar8 = DecodePredicateOperand
                        ((MCInst *)CONCAT44(numBits,startBit),Val,
                         (uint64_t)in_stack_ffffffffffffff78,(void *)0x294d72);
      _Var1 = Check(local_2c,DVar8);
      if (_Var1) {
        local_4 = local_2c[0];
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeAddrMode2IdxInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_AddrOpc Op;
	ARM_AM_ShiftOpc Opc;
	bool writeback;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned reg = fieldFromInstruction_4(Insn, 25, 1);
	unsigned P = fieldFromInstruction_4(Insn, 24, 1);
	unsigned W = fieldFromInstruction_4(Insn, 21, 1);
	unsigned idx_mode = 0, amt, tmp;

	// On stores, the writeback operand precedes Rt.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STR_POST_IMM:
		case ARM_STR_POST_REG:
		case ARM_STRB_POST_IMM:
		case ARM_STRB_POST_REG:
		case ARM_STRT_POST_REG:
		case ARM_STRT_POST_IMM:
		case ARM_STRBT_POST_REG:
		case ARM_STRBT_POST_IMM:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;

	// On loads, the writeback operand comes after Rt.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_LDR_POST_IMM:
		case ARM_LDR_POST_REG:
		case ARM_LDRB_POST_IMM:
		case ARM_LDRB_POST_REG:
		case ARM_LDRBT_POST_REG:
		case ARM_LDRBT_POST_IMM:
		case ARM_LDRT_POST_REG:
		case ARM_LDRT_POST_IMM:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	Op = ARM_AM_add;
	if (!fieldFromInstruction_4(Insn, 23, 1))
		Op = ARM_AM_sub;

	writeback = (P == 0) || (W == 1);
	if (P && writeback)
		idx_mode = ARMII_IndexModePre;
	else if (!P && writeback)
		idx_mode = ARMII_IndexModePost;

	if (writeback && (Rn == 15 || Rn == Rt))
		S = MCDisassembler_SoftFail; // UNPREDICTABLE

	if (reg) {
		if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
		Opc = ARM_AM_lsl;
		switch( fieldFromInstruction_4(Insn, 5, 2)) {
			case 0:
				Opc = ARM_AM_lsl;
				break;
			case 1:
				Opc = ARM_AM_lsr;
				break;
			case 2:
				Opc = ARM_AM_asr;
				break;
			case 3:
				Opc = ARM_AM_ror;
				break;
			default:
				return MCDisassembler_Fail;
		}
		amt = fieldFromInstruction_4(Insn, 7, 5);
		if (Opc == ARM_AM_ror && amt == 0)
			Opc = ARM_AM_rrx;
		imm = ARM_AM_getAM2Opc(Op, amt, Opc, idx_mode);

		MCOperand_CreateImm0(Inst, imm);
	} else {
		MCOperand_CreateReg0(Inst, 0);
		tmp = ARM_AM_getAM2Opc(Op, imm, ARM_AM_lsl, idx_mode);
		MCOperand_CreateImm0(Inst, tmp);
	}

	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}